

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void VP8LInverseTransform
               (VP8LTransform *transform,int row_start,int row_end,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t *in_RCX;
  uint32_t in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  uint32_t *in_R8;
  VP8LTransform *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  uint32_t *src;
  int in_stride;
  int out_stride;
  int width;
  
  uVar1 = in_RDI[2];
  switch(*in_RDI) {
  case 0:
    PredictorInverseTransform_C
              ((VP8LTransform *)src,in_stack_0000000c,in_stack_00000008,&unaff_retaddr->type_,in_RDI
              );
    if (in_EDX != in_RDI[3]) {
      memcpy(in_R8 + -(long)(int)uVar1,in_R8 + (int)(((in_EDX - in_ESI) + -1) * uVar1),
             (long)(int)uVar1 << 2);
    }
    break;
  case 1:
    ColorSpaceInverseTransform_C
              ((VP8LTransform *)src,in_stack_0000000c,in_stack_00000008,&unaff_retaddr->type_,in_RDI
              );
    break;
  case 2:
    (*VP8LAddGreenToBlueAndRed)(in_RCX,(in_EDX - in_ESI) * uVar1,in_R8);
    break;
  case 3:
    if ((in_RCX == in_R8) && (0 < (int)in_RDI[1])) {
      iVar2 = in_EDX - in_ESI;
      iVar3 = in_EDX - in_ESI;
      uVar4 = VP8LSubSampleSize(in_RDI[2],in_RDI[1]);
      iVar3 = iVar3 * uVar4;
      memmove(in_R8 + ((long)(int)(iVar2 * uVar1) - (long)iVar3),in_R8,(long)iVar3 << 2);
      ColorIndexInverseTransform_C
                (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (uint32_t *)CONCAT44(in_ESI,in_EDX),in_RCX);
    }
    else {
      ColorIndexInverseTransform_C
                (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (uint32_t *)CONCAT44(in_ESI,in_EDX),in_RCX);
    }
  }
  return;
}

Assistant:

void VP8LInverseTransform(const VP8LTransform* const transform,
                          int row_start, int row_end,
                          const uint32_t* const in, uint32_t* const out) {
  const int width = transform->xsize_;
  assert(row_start < row_end);
  assert(row_end <= transform->ysize_);
  switch (transform->type_) {
    case SUBTRACT_GREEN_TRANSFORM:
      VP8LAddGreenToBlueAndRed(in, (row_end - row_start) * width, out);
      break;
    case PREDICTOR_TRANSFORM:
      PredictorInverseTransform_C(transform, row_start, row_end, in, out);
      if (row_end != transform->ysize_) {
        // The last predicted row in this iteration will be the top-pred row
        // for the first row in next iteration.
        memcpy(out - width, out + (row_end - row_start - 1) * width,
               width * sizeof(*out));
      }
      break;
    case CROSS_COLOR_TRANSFORM:
      ColorSpaceInverseTransform_C(transform, row_start, row_end, in, out);
      break;
    case COLOR_INDEXING_TRANSFORM:
      if (in == out && transform->bits_ > 0) {
        // Move packed pixels to the end of unpacked region, so that unpacking
        // can occur seamlessly.
        // Also, note that this is the only transform that applies on
        // the effective width of VP8LSubSampleSize(xsize_, bits_). All other
        // transforms work on effective width of xsize_.
        const int out_stride = (row_end - row_start) * width;
        const int in_stride = (row_end - row_start) *
            VP8LSubSampleSize(transform->xsize_, transform->bits_);
        uint32_t* const src = out + out_stride - in_stride;
        memmove(src, out, in_stride * sizeof(*src));
        ColorIndexInverseTransform_C(transform, row_start, row_end, src, out);
      } else {
        ColorIndexInverseTransform_C(transform, row_start, row_end, in, out);
      }
      break;
  }
}